

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

void __thiscall doctest::anon_unknown_15::XmlReporter::log_contexts(XmlReporter *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  stringstream ss;
  ScopedElement local_208;
  string local_200;
  IContextScope **local_1e0;
  string local_1d8;
  stringstream local_1b8 [16];
  undefined1 local_1a8 [8];
  string local_1a0 [104];
  ios_base local_138 [264];
  
  detail::g_infoContexts::__tls_init();
  uVar2 = (uint)((ulong)(*(long *)(in_FS_OFFSET + -0x28) - *(long *)(in_FS_OFFSET + -0x30)) >> 3);
  if (uVar2 != 0) {
    local_1e0 = IReporter::get_active_contexts();
    std::__cxx11::stringstream::stringstream(local_1b8);
    if (0 < (int)uVar2) {
      paVar1 = &local_200.field_2;
      uVar3 = 0;
      do {
        (*local_1e0[uVar3]->_vptr_IContextScope[2])(local_1e0[uVar3],local_1a8);
        local_200._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"Info","");
        local_208.m_writer = &this->xml;
        XmlWriter::startElement(&this->xml,&local_200);
        std::__cxx11::stringbuf::str();
        XmlWriter::ScopedElement::writeText(&local_208,&local_1d8,true);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
          operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
        }
        XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_208.m_writer);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_200._M_dataplus._M_p != paVar1) {
          operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
        }
        local_200._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"");
        std::__cxx11::stringbuf::str(local_1a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_200._M_dataplus._M_p != paVar1) {
          operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
        }
        uVar3 = uVar3 + 1;
      } while ((uVar2 & 0x7fffffff) != uVar3);
    }
    std::__cxx11::stringstream::~stringstream(local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  return;
}

Assistant:

void log_contexts() {
            int num_contexts = get_num_active_contexts();
            if(num_contexts) {
                auto              contexts = get_active_contexts();
                std::stringstream ss;
                for(int i = 0; i < num_contexts; ++i) {
                    contexts[i]->stringify(&ss);
                    xml.scopedElement("Info").writeText(ss.str());
                    ss.str("");
                }
            }
        }